

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O0

void __thiscall DIntermissionController::Ticker(DIntermissionController *this)

{
  bool bVar1;
  int iVar2;
  DIntermissionScreen *pDVar3;
  char *musicname;
  DIntermissionController *this_local;
  
  if ((this->mAdvance & 1U) != 0) {
    this->mSentAdvance = false;
  }
  bVar1 = TObjPtr<DIntermissionScreen>::operator!=(&this->mScreen,(DIntermissionScreen *)0x0);
  if (bVar1) {
    pDVar3 = TObjPtr<DIntermissionScreen>::operator->(&this->mScreen);
    iVar2 = (*(pDVar3->super_DObject)._vptr_DObject[9])();
    this->mAdvance = (this->mAdvance & 1U) != 0 || iVar2 == -1;
  }
  if ((this->mAdvance & 1U) != 0) {
    this->mAdvance = false;
    bVar1 = NextPage(this);
    if (!bVar1) {
      if (this->mGameState == '\x01') {
        gameaction = ga_worlddone;
        (*(this->super_DObject)._vptr_DObject[4])();
      }
      else if (this->mGameState == '\x02') {
        if ((::level.cdtrack == 0) ||
           (bVar1 = S_ChangeCDMusic(::level.cdtrack,::level.cdid,true), !bVar1)) {
          musicname = FString::operator_cast_to_char_(&::level.Music);
          S_ChangeMusic(musicname,::level.musicorder,true,false);
        }
        gamestate = GS_LEVEL;
        wipegamestate = GS_LEVEL;
        P_ResumeConversation();
        viewactive = true;
        (*(this->super_DObject)._vptr_DObject[4])();
      }
    }
  }
  return;
}

Assistant:

void DIntermissionController::Ticker ()
{
	if (mAdvance)
	{
		mSentAdvance = false;
	}
	if (mScreen != NULL)
	{
		mAdvance |= (mScreen->Ticker() == -1);
	}
	if (mAdvance)
	{
		mAdvance = false;
		if (!NextPage())
		{
			switch (mGameState)
			{
			case FSTATE_InLevel:
				if (level.cdtrack == 0 || !S_ChangeCDMusic (level.cdtrack, level.cdid))
					S_ChangeMusic (level.Music, level.musicorder);
				gamestate = GS_LEVEL;
				wipegamestate = GS_LEVEL;
				P_ResumeConversation ();
				viewactive = true;
				Destroy();
				break;

			case FSTATE_ChangingLevel:
				gameaction = ga_worlddone;
				Destroy();
				break;

			default:
				break;
			}
		}
	}
}